

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

int __thiscall Samba::init(Samba *this,EVP_PKEY_CTX *ctx)

{
  SerialPort *pSVar1;
  long lVar2;
  pointer pcVar3;
  uint8_t cmd [3];
  string ver;
  string local_448;
  uint8_t dummy [1024];
  
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[9])(pSVar1,100);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[5])(pSVar1,dummy,0x400);
  if (this->_isUsb == false) {
    if (this->_debug == true) {
      puts("Send auto-baud");
    }
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x80);
    (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x80);
    (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
       super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
       super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[7])();
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[8])(pSVar1,0x23);
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SerialPort[5])(pSVar1,cmd,3);
  }
  if (this->_debug == true) {
    puts("Set binary mode");
  }
  cmd[0] = 'N';
  cmd[1] = '#';
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[6])(pSVar1,cmd,2);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[5])(pSVar1,cmd,2);
  ver._M_dataplus._M_p = (pointer)&ver.field_2;
  ver._M_string_length = 0;
  ver.field_2._M_local_buf[0] = '\0';
  version_abi_cxx11_(&local_448,this);
  std::__cxx11::string::operator=((string *)&ver,(string *)&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  lVar2 = std::__cxx11::string::find((char *)&ver,0x110504);
  if (lVar2 != -1) {
    pcVar3 = ver._M_dataplus._M_p + lVar2 + 9;
    do {
      switch(*pcVar3) {
      case 'X':
        this->_canChipErase = true;
        break;
      case 'Y':
        this->_canWriteBuffer = true;
        break;
      case 'Z':
        this->_canChecksumBuffer = true;
        break;
      case ']':
        goto switchD_0010a5c3_caseD_5d;
      }
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
LAB_0010a5e7:
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SerialPort[9])(pSVar1,1000);
  std::__cxx11::string::~string((string *)&ver);
  return (int)CONCAT71((int7)((ulong)this >> 8),1);
switchD_0010a5c3_caseD_5d:
  if (this->_isUsb == true) {
    this->_readBufferSize = 0x3f;
  }
  goto LAB_0010a5e7;
}

Assistant:

bool
Samba::init()
{
    
    uint8_t cmd[3];
    _port->timeout(TIMEOUT_QUICK);

    // Flush garbage
    uint8_t dummy[1024];
    _port->read(dummy, sizeof(dummy));

    if (!_isUsb)
    {
        if (_debug)
            printf("Send auto-baud\n");

        // RS-232 auto-baud sequence
        _port->put(0x80);
        _port->get();
        _port->put(0x80);
        _port->get();
        _port->put('#');
        _port->read(cmd, 3);
    }

    // Set binary mode
    if (_debug)
        printf("Set binary mode\n");

    cmd[0] = 'N';
    cmd[1] = '#';
    _port->write(cmd, 2);
    
    _port->read(cmd, 2);


    std::string ver;
    try
    {
        ver = version();
    }
    catch(SambaError& err)
    {
        return false;
    }

    std::size_t extIndex = ver.find("[Arduino:");
    
     
    if (extIndex != string::npos)
    {
        extIndex += 9;
        while (ver[extIndex] != ']')
        {
            switch (ver[extIndex])
            {
                case 'X': _canChipErase = true; break;
                case 'Y': _canWriteBuffer = true; break;
                case 'Z': _canChecksumBuffer = true; break;
            }
            extIndex++;
        }

        // All SAMD-based Arduino/AdaFruit boards have a bug in their bootloader
        // that trying to read 64 bytes or more over USB corrupts the data.
        // We must limit these boards to read chunks of 63 bytes.
        if (_isUsb)
            _readBufferSize = 63;
    }

    _port->timeout(TIMEOUT_NORMAL);

    return true;
}